

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_assertion_tests.cpp
# Opt level: O3

void __thiscall
iu_Expression_x_iutest_x_Monadic_Test::Body(iu_Expression_x_iutest_x_Monadic_Test *this)

{
  pointer pcVar1;
  char *in_R9;
  AssertionResult iutest_ar;
  allocator<char> local_221;
  AssertionHelper local_220;
  string local_1f0;
  long *local_1d0 [2];
  long local_1c0 [2];
  char local_1b0;
  undefined1 local_1a8 [32];
  bool local_188;
  ios_base local_128 [264];
  
  local_1f0._M_dataplus._M_p._0_4_ = CONCAT31(local_1f0._M_dataplus._M_p._1_3_,1);
  iutest::detail::ExpressionLHS<bool>::ExpressionLHS
            ((ExpressionLHS<bool> *)&local_220,(bool *)&local_1f0);
  iutest::detail::ExpressionLHS<bool>::GetResult
            ((AssertionResult *)local_1a8,(ExpressionLHS<bool> *)&local_220,true);
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_1a8._0_8_,(pointer)(local_1a8._0_8_ + local_1a8._8_8_));
  local_1b0 = local_188;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar1 = (pointer)((long)&local_220.m_part_result.super_iuCodeMessage.m_message.field_2 + 8);
  if ((pointer)local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length != pcVar1) {
    operator_delete((void *)local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length,
                    local_220.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ + 1);
  }
  if (local_1b0 == '\0') {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1d0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((true))","false","true",
               in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               (char *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_),
               &local_221);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x28;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_220.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  local_1f0._M_dataplus._M_p._0_4_ = 0x2a;
  iutest::detail::ExpressionLHS<int>::ExpressionLHS
            ((ExpressionLHS<int> *)&local_220,(int *)&local_1f0);
  iutest::detail::ExpressionLHS<int>::GetResult
            ((AssertionResult *)local_1a8,(ExpressionLHS<int> *)&local_220,true);
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1d0,local_1a8._0_8_,(pointer)(local_1a8._0_8_ + local_1a8._8_8_));
  local_1b0 = local_188;
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if ((pointer)local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length != pcVar1) {
    operator_delete((void *)local_220.m_part_result.super_iuCodeMessage.m_message._M_string_length,
                    local_220.m_part_result.super_iuCodeMessage.m_message.field_2._8_8_ + 1);
  }
  if (local_1b0 == '\0') {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_1f0,(internal *)local_1d0,
               (AssertionResult *)"IIUT_TEST_EXPRESSION_EXPAND_EXPRESSION((f()))","false","true",
               in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,
               (char *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_),
               &local_221);
    local_220.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/expression_assertion_tests.cpp"
    ;
    local_220.m_part_result.super_iuCodeMessage.m_line = 0x29;
    local_220.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_220,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_220.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_220.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_220.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_) !=
        &local_1f0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1f0._M_dataplus._M_p._4_4_,local_1f0._M_dataplus._M_p._0_4_),
                      local_1f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base(local_128);
  }
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  return;
}

Assistant:

IUTEST(Expression, Monadic)
{
    IUTEST_EXPECT(true);
    IUTEST_EXPECT(f());
}